

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_text.cpp
# Opt level: O0

char * __thiscall
flatbuffers::JsonPrinter::
PrintContainer<flatbuffers::Vector<unsigned_long,unsigned_int>,unsigned_int>
          (JsonPrinter *this,Vector<unsigned_long,_unsigned_int> *param_2,uint param_3,Type *param_4
          ,int param_5)

{
  int iVar1;
  return_type val;
  uint local_48;
  uint i;
  int elem_indent;
  uint8_t *param_6_local;
  int indent_local;
  Type *type_local;
  uint size_local;
  Vector<unsigned_long,_unsigned_int> *c_local;
  JsonPrinter *this_local;
  
  iVar1 = Indent(this);
  std::__cxx11::string::operator+=((string *)this->text,'[');
  AddNewLine(this);
  for (local_48 = 0; local_48 < param_3; local_48 = local_48 + 1) {
    if (local_48 != 0) {
      AddComma(this);
      AddNewLine(this);
    }
    AddIndent(this,param_5 + iVar1);
    val = Vector<unsigned_long,_unsigned_int>::operator[](param_2,local_48);
    PrintScalar<unsigned_long>(this,val,param_4,param_5 + iVar1);
  }
  AddNewLine(this);
  AddIndent(this,param_5);
  std::__cxx11::string::operator+=((string *)this->text,']');
  return (char *)0x0;
}

Assistant:

const char *PrintContainer(PrintScalarTag, const Container &c, SizeT size,
                             const Type &type, int indent, const uint8_t *) {
    const auto elem_indent = indent + Indent();
    text += '[';
    AddNewLine();
    for (SizeT i = 0; i < size; i++) {
      if (i) {
        AddComma();
        AddNewLine();
      }
      AddIndent(elem_indent);
      PrintScalar(c[i], type, elem_indent);
    }
    AddNewLine();
    AddIndent(indent);
    text += ']';
    return nullptr;
  }